

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

ByteData256 * __thiscall
cfd::core::TapBranch::GetTapTweak
          (ByteData256 *__return_storage_ptr__,TapBranch *this,SchnorrPubkey *internal_pubkey)

{
  bool bVar1;
  int iVar2;
  HashUtil *pHVar3;
  ByteData local_d8;
  HashUtil local_c0;
  undefined1 local_98 [8];
  HashUtil hasher;
  allocator local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  ByteData256 hash;
  SchnorrPubkey *internal_pubkey_local;
  TapBranch *this_local;
  
  hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)internal_pubkey;
  GetCurrentBranchHash((ByteData256 *)local_38,this);
  if (GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash == '\0') {
    iVar2 = __cxa_guard_acquire(&GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash);
    if (iVar2 != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_58,"TapTweak",&local_59);
      HashUtil::Sha256(&GetTapTweak::kTaggedHash,(string *)local_58);
      ::std::__cxx11::string::~string(local_58);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_59);
      __cxa_atexit(ByteData256::~ByteData256,&GetTapTweak::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&GetTapTweak(cfd::core::SchnorrPubkey_const&)::kTaggedHash);
    }
  }
  HashUtil::HashUtil(&local_c0,'\x03');
  pHVar3 = HashUtil::operator<<(&local_c0,&GetTapTweak::kTaggedHash);
  pHVar3 = HashUtil::operator<<(pHVar3,&GetTapTweak::kTaggedHash);
  SchnorrPubkey::GetData
            (&local_d8,
             (SchnorrPubkey *)
             hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage);
  pHVar3 = HashUtil::operator<<(pHVar3,&local_d8);
  HashUtil::HashUtil((HashUtil *)local_98,pHVar3);
  ByteData::~ByteData((ByteData *)0x4937a0);
  HashUtil::~HashUtil(&local_c0);
  bVar1 = ByteData256::IsEmpty((ByteData256 *)local_38);
  if (!bVar1) {
    HashUtil::operator<<((HashUtil *)local_98,(ByteData256 *)local_38);
  }
  HashUtil::Output256(__return_storage_ptr__,(HashUtil *)local_98);
  HashUtil::~HashUtil((HashUtil *)local_98);
  ByteData256::~ByteData256((ByteData256 *)0x4938aa);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 TapBranch::GetTapTweak(
    const SchnorrPubkey& internal_pubkey) const {
  ByteData256 hash = GetCurrentBranchHash();
  static auto kTaggedHash = HashUtil::Sha256("TapTweak");
  auto hasher = HashUtil(HashUtil::kSha256)
                << kTaggedHash << kTaggedHash << internal_pubkey.GetData();
  if (!hash.IsEmpty()) hasher << hash;
  return hasher.Output256();
}